

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O1

void NULLC::HandleError(int signum,siginfo_t *info,void *ucontext)

{
  RegVmRegister *pRVar1;
  RegVmRegister *pRVar2;
  uchar *address;
  ExpiredCodeBlock *pEVar3;
  uchar *puVar4;
  CodeGenRegVmCallStackEntry *pCVar5;
  bool bVar6;
  ExecutorX86 *this;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  char *error;
  
  this = currExecutor;
  if (signum == 0xb) {
    pRVar1 = (RegVmRegister *)(info->_sifields)._sigfault.si_addr;
    pRVar2 = (RegVmRegister *)(currExecutor->vmState).callStackEnd;
    if (pRVar1 <= pRVar2 + 0x400 && pRVar2 <= pRVar1) {
      error = "ERROR: call stack overflow";
      goto LAB_0025167e;
    }
    pRVar2 = (RegVmRegister *)(currExecutor->vmState).dataStackEnd;
    if (pRVar1 <= pRVar2 + 0x400 && pRVar2 <= pRVar1) {
      error = "ERROR: stack overflow";
      goto LAB_0025167e;
    }
    pRVar2 = (currExecutor->vmState).regFileArrayEnd;
    if (pRVar1 <= pRVar2 + 0x400 && pRVar2 <= pRVar1) {
      error = "ERROR: register overflow";
      goto LAB_0025167e;
    }
  }
  address = *(uchar **)((long)ucontext + 0xa8);
  if (address < currExecutor->binCode) {
    bVar6 = false;
  }
  else {
    bVar6 = address <= currExecutor->binCode + currExecutor->binCodeSize;
  }
  uVar7 = 0xffffffff;
  if (bVar6) {
    uVar7 = GetInstructionFromAddress((uintptr_t)address);
  }
  uVar8 = (ulong)(this->expiredCodeBlocks).count;
  if (uVar8 != 0) {
    pEVar3 = (this->expiredCodeBlocks).data;
    lVar9 = 0;
    do {
      puVar4 = *(uchar **)((long)&pEVar3->code + lVar9);
      if ((puVar4 <= address) && (address <= puVar4 + *(uint *)((long)&pEVar3->codeSize + lVar9))) {
        bVar6 = true;
        break;
      }
      lVar9 = lVar9 + 0x18;
    } while (uVar8 * 0x18 != lVar9);
  }
  if ((!bVar6) && ((this->vmState).jitCodeActive == false)) {
LAB_00251606:
    signal(signum,(__sighandler_t)0x0);
    raise(signum);
    return;
  }
  if (signum == 8) {
    if (uVar7 != 0xffffffff) {
      pCVar5 = (this->vmState).callStackTop;
      pCVar5->instruction = uVar7;
      (this->vmState).callStackTop = pCVar5 + 1;
    }
    error = "ERROR: integer division by zero";
  }
  else {
    if ((signum != 0xb) || ((void *)0xffff < (info->_sifields)._sigfault.si_addr))
    goto LAB_00251606;
    if (uVar7 != 0xffffffff) {
      pCVar5 = (this->vmState).callStackTop;
      pCVar5->instruction = uVar7;
      (this->vmState).callStackTop = pCVar5 + 1;
    }
    error = "ERROR: null pointer access";
  }
LAB_0025167e:
  ExecutorX86::Stop(this,error);
  siglongjmp((__jmp_buf_tag *)errorHandler,1);
}

Assistant:

void HandleError(int signum, siginfo_t *info, void *ucontext)
	{
		if(signum == SIGSEGV && uintptr_t(info->si_addr) >= uintptr_t(currExecutor->vmState.callStackEnd) && uintptr_t(info->si_addr) <= uintptr_t(currExecutor->vmState.callStackEnd) + 8192)
		{
			currExecutor->Stop("ERROR: call stack overflow");
			siglongjmp(errorHandler, 1);
		}

		if(signum == SIGSEGV && uintptr_t(info->si_addr) >= uintptr_t(currExecutor->vmState.dataStackEnd) && uintptr_t(info->si_addr) <= uintptr_t(currExecutor->vmState.dataStackEnd) + 8192)
		{
			currExecutor->Stop("ERROR: stack overflow");
			siglongjmp(errorHandler, 1);
		}

		if(signum == SIGSEGV && uintptr_t(info->si_addr) >= uintptr_t(currExecutor->vmState.regFileArrayEnd) && uintptr_t(info->si_addr) <= uintptr_t(currExecutor->vmState.regFileArrayEnd) + 8192)
		{
			currExecutor->Stop("ERROR: register overflow");
			siglongjmp(errorHandler, 1);
		}

#if defined(_M_X64)
		uintptr_t address = uintptr_t(((ucontext_t*)ucontext)->uc_mcontext.gregs[REG_RIP]);
#else
		uintptr_t address = uintptr_t(((ucontext_t*)ucontext)->uc_mcontext.gregs[REG_EIP]);
#endif

		// Check that exception happened in NULLC code
		bool isInternal = address >= uintptr_t(currExecutor->binCode) && address <= uintptr_t(currExecutor->binCode + currExecutor->binCodeSize);

		unsigned internalInstruction = isInternal ? GetInstructionFromAddress(address) : ~0u;

		for(unsigned i = 0; i < currExecutor->expiredCodeBlocks.size(); i++)
		{
			if(address >= uintptr_t(currExecutor->expiredCodeBlocks[i].code) && address <= uintptr_t(currExecutor->expiredCodeBlocks[i].code + currExecutor->expiredCodeBlocks[i].codeSize))
			{
				isInternal = true;
				break;
			}
		}

		if(currExecutor->vmState.jitCodeActive)
			isInternal = true;

		if(!isInternal)
		{
			signal(signum, SIG_DFL);
			raise(signum);
			return;
		}

		if(signum == SIGFPE)
		{
			AddCrashStackFrame(internalInstruction);

			currExecutor->Stop("ERROR: integer division by zero");

			siglongjmp(errorHandler, 1);
		}

		if(signum == SIGSEGV && uintptr_t(info->si_addr) < 0x00010000)
		{
			AddCrashStackFrame(internalInstruction);

			currExecutor->Stop("ERROR: null pointer access");

			siglongjmp(errorHandler, 1);
		}

		signal(signum, SIG_DFL);
		raise(signum);
	}